

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

bool __thiscall cmQtAutoMocUic::JobParseT::ReadFile(JobParseT *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *text;
  void *pvVar2;
  bool bVar3;
  long *plVar4;
  ulong *puVar5;
  string error;
  string local_60;
  string local_40;
  
  ParseCacheT::FileT::Clear
            ((((this->FileHandle).
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             ParseData).
             super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  text = (this->FileHandle).
         super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pvVar2 = ((this->super_JobT).super_JobT.Pool_)->UserData_;
  if (*(int *)((long)pvVar2 + 0x98) != 0) {
    cmQtAutoGen::Quoted(&local_40,&text->FileName);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x517ad3);
    puVar5 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_60.field_2._M_allocated_capacity = *puVar5;
      local_60.field_2._8_8_ = plVar4[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *puVar5;
      local_60._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_60._M_string_length = plVar4[1];
    *plVar4 = (long)puVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    cmQtAutoGenerator::Logger::Info((Logger *)((long)pvVar2 + 0x70),GEN,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_allocated_capacity =
       local_60.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = cmQtAutoGenerator::FileRead(&this->Content,&text->FileName,&local_60);
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((this->Content)._M_string_length != 0) {
      return true;
    }
    pvVar2 = ((this->super_JobT).super_JobT.Pool_)->UserData_;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"The file is empty.","");
    cmQtAutoGenerator::Logger::WarningFile
              ((Logger *)((long)pvVar2 + 0x70),GEN,&text->FileName,&local_60);
  }
  else {
    std::operator+(&local_40,"Could not read the file: ",&local_60);
    pvVar2 = ((this->super_JobT).super_JobT.Pool_)->UserData_;
    LOCK();
    *(undefined1 *)((long)pvVar2 + 0x808) = 1;
    UNLOCK();
    cmWorkerPool::Abort((cmWorkerPool *)((long)pvVar2 + 0x810));
    cmQtAutoGenerator::Logger::ErrorFile
              ((Logger *)((long)((this->super_JobT).super_JobT.Pool_)->UserData_ + 0x70),GEN,
               &text->FileName,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmQtAutoMocUic::JobParseT::ReadFile()
{
  // Clear old parse information
  FileHandle->ParseData->Clear();
  std::string const& fileName = FileHandle->FileName;
  // Write info
  if (Log().Verbose()) {
    Log().Info(GenT::GEN, "Parsing " + Quoted(fileName));
  }
  // Read file content
  {
    std::string error;
    if (!cmQtAutoGenerator::FileRead(Content, fileName, &error)) {
      LogFileError(GenT::GEN, fileName, "Could not read the file: " + error);
      return false;
    }
  }
  // Warn if empty
  if (Content.empty()) {
    Log().WarningFile(GenT::GEN, fileName, "The file is empty.");
    return false;
  }
  return true;
}